

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

shared_ptr<kratos::Expr> __thiscall kratos::util::mux(util *this,Var *cond,Var *left,Var *right)

{
  int iVar1;
  element_type *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<kratos::Expr> sVar2;
  shared_ptr<kratos::Expr> local_88;
  enable_shared_from_this<kratos::Var> local_78 [2];
  enable_shared_from_this<kratos::Var> local_58;
  enable_shared_from_this<kratos::Var> local_48;
  undefined1 local_38 [8];
  shared_ptr<kratos::ConditionalExpr> expr;
  Var *right_local;
  Var *left_local;
  Var *cond_local;
  
  expr.super___shared_ptr<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)right;
  std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_48);
  std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_58);
  std::enable_shared_from_this<kratos::Var>::shared_from_this(local_78);
  std::
  make_shared<kratos::ConditionalExpr,std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::Var>>
            ((shared_ptr<kratos::Var> *)local_38,(shared_ptr<kratos::Var> *)&local_48,
             (shared_ptr<kratos::Var> *)&local_58);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_78);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_58);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_48);
  this_00 = std::
            __shared_ptr_access<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_38);
  iVar1 = (*(cond->super_IRNode)._vptr_IRNode[0xd])();
  Var::set_generator((Var *)this_00,(Generator *)CONCAT44(extraout_var,iVar1));
  iVar1 = (*(cond->super_IRNode)._vptr_IRNode[0xd])();
  std::shared_ptr<kratos::Expr>::shared_ptr<kratos::ConditionalExpr,void>
            (&local_88,(shared_ptr<kratos::ConditionalExpr> *)local_38);
  Generator::add_expr((Generator *)CONCAT44(extraout_var_00,iVar1),&local_88);
  std::shared_ptr<kratos::Expr>::~shared_ptr(&local_88);
  std::shared_ptr<kratos::Expr>::shared_ptr<kratos::ConditionalExpr,void>
            ((shared_ptr<kratos::Expr> *)this,(shared_ptr<kratos::ConditionalExpr> *)local_38);
  std::shared_ptr<kratos::ConditionalExpr>::~shared_ptr
            ((shared_ptr<kratos::ConditionalExpr> *)local_38);
  sVar2.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Expr>)
         sVar2.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expr> util::mux(Var &cond, Var &left, Var &right) {
    auto expr = std::make_shared<ConditionalExpr>(cond.shared_from_this(), left.shared_from_this(),
                                                  right.shared_from_this());
    expr->set_generator(cond.generator());
    cond.generator()->add_expr(expr);
    return expr;
}